

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_7::ToValueString<int>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  uint uVar1;
  uint uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  uint __val;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  string __str;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_38 = (ulong)*(uint *)(binary + region->offset);
  if (region->length != 0) {
    pbVar4 = binary + region->offset + region->length;
    uVar5 = 0;
    uVar3 = extraout_RDX;
    do {
      pbVar4 = pbVar4 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar4,(uint8_t)uVar3);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar3 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar3 = extraout_RDX_01;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar6 = (uint)local_38;
  __val = -uVar6;
  if (0 < (int)uVar6) {
    __val = uVar6;
  }
  uVar6 = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      uVar6 = uVar1;
      uVar2 = (uint)uVar5;
      if (uVar2 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_003232a2;
      }
      if (uVar2 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_003232a2;
      }
      if (uVar2 < 10000) goto LAB_003232a2;
      uVar5 = uVar5 / 10000;
      uVar1 = uVar6 + 4;
    } while (99999 < uVar2);
    uVar6 = uVar6 + 1;
  }
LAB_003232a2:
  uVar5 = local_38 >> 0x1f & 1;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar6 + (char)uVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_60._M_dataplus._M_p + uVar5,uVar6,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}